

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O0

StatusOr<google::protobuf::FeatureResolver> * __thiscall
google::protobuf::(anonymous_namespace)::
SetupFeatureResolver<google::protobuf::internal::ExtensionIdentifier<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false>>
          (StatusOr<google::protobuf::FeatureResolver> *__return_storage_ptr__,
          _anonymous_namespace_ *this,Edition edition,
          ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
          extensions)

{
  initializer_list<const_google::protobuf::FieldDescriptor_*> v;
  undefined4 edition_00;
  bool bVar1;
  Descriptor *this_00;
  Descriptor *descriptor;
  Status *x;
  FeatureSetDefaults *compiled_defaults;
  Span<const_google::protobuf::FieldDescriptor_*const> extensions_00;
  Edition in_stack_ffffffffffffff28;
  Status local_98;
  Status _status;
  Descriptor *local_78;
  pointer local_70;
  undefined1 local_68 [8];
  StatusOr<google::protobuf::FeatureSetDefaults> defaults;
  undefined1 local_20 [4];
  Edition edition_local;
  ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
  extensions_local;
  
  extensions_local._0_8_ = extensions._0_8_;
  defaults.super_StatusOrData<google::protobuf::FeatureSetDefaults>.field_1._52_4_ = SUB84(this,0);
  local_20 = (undefined1  [4])edition;
  extensions_local.default_value_ = __return_storage_ptr__;
  this_00 = FeatureSet::descriptor();
  descriptor = FeatureSet::descriptor();
  _status.rep_ = (uintptr_t)
                 GetExtension<google::protobuf::internal::ExtensionIdentifier<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false>>
                           ((ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                             *)local_20,descriptor);
  v._M_len = 1;
  v._M_array = (iterator)&_status;
  absl::lts_20250127::Span<google::protobuf::FieldDescriptor_const*const>::
  Span<google::protobuf::FieldDescriptor_const*const,google::protobuf::FieldDescriptor_const*const>
            ((Span<google::protobuf::FieldDescriptor_const*const> *)&local_78,v);
  extensions_00.len_ = 1000;
  extensions_00.ptr_ = local_70;
  FeatureResolver::CompileDefaults
            ((StatusOr<google::protobuf::FeatureSetDefaults> *)local_68,(FeatureResolver *)this_00,
             local_78,extensions_00,EDITION_99997_TEST_ONLY,in_stack_ffffffffffffff28);
  x = absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::status
                ((StatusOr<google::protobuf::FeatureSetDefaults> *)local_68);
  absl::lts_20250127::Status::Status(&local_98,x);
  bVar1 = absl::lts_20250127::Status::ok(&local_98);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    absl::lts_20250127::StatusOr<google::protobuf::FeatureResolver>::
    StatusOr<const_absl::lts_20250127::Status,_0>(__return_storage_ptr__,&local_98);
  }
  absl::lts_20250127::Status::~Status(&local_98);
  edition_00 = defaults.super_StatusOrData<google::protobuf::FeatureSetDefaults>.field_1._52_4_;
  if (!bVar1) {
    compiled_defaults =
         absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::operator*
                   ((StatusOr<google::protobuf::FeatureSetDefaults> *)local_68);
    FeatureResolver::Create(__return_storage_ptr__,edition_00,compiled_defaults);
  }
  absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::~StatusOr
            ((StatusOr<google::protobuf::FeatureSetDefaults> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FeatureResolver> SetupFeatureResolver(Edition edition,
                                                     Extensions... extensions) {
  absl::StatusOr<FeatureSetDefaults> defaults =
      FeatureResolver::CompileDefaults(FeatureSet::descriptor(),
                                       {GetExtension(extensions)...},
                                       EDITION_2023, EDITION_99997_TEST_ONLY);
  RETURN_IF_ERROR(defaults.status());
  return FeatureResolver::Create(edition, *defaults);
}